

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void QApplication::setFont(QFont *font,char *className)

{
  QObject *pQVar1;
  QWidget **ppQVar2;
  char cVar3;
  QHash<QByteArray,QFont> *this;
  long lVar4;
  QFont *this_00;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QList<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QHash<QByteArray,QFont> *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::operator()
                   ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                     *)font);
  if (className == (char *)0x0) {
    QGuiApplication::setFont(font);
    if (((this != (QHash<QByteArray,QFont> *)0x0) && (*(long *)this != 0)) &&
       (*(long *)(*(long *)this + 8) != 0)) {
      QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)this);
    }
  }
  else if (this != (QHash<QByteArray,QFont> *)0x0) {
    QByteArray::QByteArray((QByteArray *)&local_58,className,-1);
    QHash<QByteArray,QFont>::emplace<QFont_const&>(this,(QByteArray *)&local_58,font);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (((char)QCoreApplicationPrivate::is_app_running == '\x01') &&
     ((char)QCoreApplicationPrivate::is_app_closing == '\0')) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,ApplicationFontChange);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    if (QWidgetPrivate::allWidgets == (QWidgetSet *)0x0) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (QWidget **)0x0;
      local_58.d.size = 0;
    }
    else {
      QSet<QWidget_*>::values(&local_58,QWidgetPrivate::allWidgets);
    }
    ppQVar2 = local_58.d.ptr;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      lVar7 = local_58.d.size << 3;
      lVar5 = 0;
      do {
        pQVar1 = *(QObject **)((long)ppQVar2 + lVar5);
        if ((*(byte *)(*(long *)(pQVar1 + 0x20) + 0xc) & 1) == 0) {
          lVar4 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,className);
          if (lVar4 != 0) {
            QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_68);
          }
        }
        lVar5 = lVar5 + 8;
      } while (lVar7 != lVar5);
    }
    lVar5 = *(long *)(QCoreApplication::self + 8);
    if (*(long *)(lVar5 + 0x188) != 0) {
      puVar6 = *(undefined8 **)(lVar5 + 0x180);
      do {
        QCoreApplication::sendEvent((QObject *)*puVar6,(QEvent *)&local_68);
        puVar6 = puVar6 + 1;
      } while (puVar6 != (undefined8 *)(*(long *)(lVar5 + 0x188) * 8 + *(long *)(lVar5 + 0x180)));
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
    QEvent::~QEvent((QEvent *)&local_68);
  }
  if (className == (char *)0x0) {
    if (QApplicationPrivate::sys_font != (QFont *)0x0) {
      cVar3 = QFont::isCopyOf(font);
      if (cVar3 != '\0') goto LAB_002bb61d;
    }
    if (QApplicationPrivate::set_font == (QFont *)0x0) {
      this_00 = (QFont *)operator_new(0x10);
      QFont::QFont(this_00,font);
      QApplicationPrivate::set_font = this_00;
    }
    else {
      QFont::operator=(QApplicationPrivate::set_font,font);
    }
  }
LAB_002bb61d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplication::setFont(const QFont &font, const char *className)
{
    FontHash *hash = app_fonts();
    if (!className) {
        QGuiApplication::setFont(font);
        if (hash && hash->size())
            hash->clear();
    } else if (hash) {
        hash->insert(className, font);
    }
    if (QApplicationPrivate::is_app_running && !QApplicationPrivate::is_app_closing) {
        QEvent e(QEvent::ApplicationFontChange);
        QWidgetList wids = QApplication::allWidgets();
        for (QWidgetList::ConstIterator it = wids.constBegin(), cend = wids.constEnd(); it != cend; ++it) {
            QWidget *w = *it;
            if (!w->isWindow() && w->inherits(className)) // matching class
                sendEvent(w, &e);
        }

#if QT_CONFIG(graphicsview)
        // Send to all scenes as well.
        QList<QGraphicsScene *> &scenes = qApp->d_func()->scene_list;
        for (QList<QGraphicsScene *>::ConstIterator it = scenes.constBegin();
             it != scenes.constEnd(); ++it) {
            QCoreApplication::sendEvent(*it, &e);
        }
#endif // QT_CONFIG(graphicsview)
    }
    if (!className && (!QApplicationPrivate::sys_font || !font.isCopyOf(*QApplicationPrivate::sys_font))) {
        if (!QApplicationPrivate::set_font)
            QApplicationPrivate::set_font = new QFont(font);
        else
            *QApplicationPrivate::set_font = font;
    }
}